

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

int argon2_verify_ctx(argon2_context *context,char *hash,argon2_type type)

{
  int iVar1;
  int ret;
  argon2_type type_local;
  char *hash_local;
  argon2_context *context_local;
  
  context_local._4_4_ = argon2_ctx(context,type);
  if (context_local._4_4_ == 0) {
    iVar1 = argon2_compare((uint8_t *)hash,context->out,(ulong)context->outlen);
    if (iVar1 == 0) {
      context_local._4_4_ = 0;
    }
    else {
      context_local._4_4_ = -0x23;
    }
  }
  return context_local._4_4_;
}

Assistant:

int argon2_verify_ctx(argon2_context *context, const char *hash,
                      argon2_type type) {
    int ret = argon2_ctx(context, type);
    if (ret != ARGON2_OK) {
        return ret;
    }

    if (argon2_compare((uint8_t *)hash, context->out, context->outlen)) {
        return ARGON2_VERIFY_MISMATCH;
    }

    return ARGON2_OK;
}